

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

Frag __thiscall
re2::Compiler::PostVisit
          (Compiler *this,Regexp *re,Frag param_2,Frag param_3,Frag *child_frags,int nchild_frags)

{
  CharClass CVar1;
  bool foldcase;
  Rune RVar2;
  int iVar3;
  uint uVar4;
  CharClass *pCVar5;
  Frag FVar6;
  Frag FVar7;
  Frag a;
  ostream *this_00;
  Rune *pRVar8;
  EmptyOp empty;
  int i;
  long lVar9;
  ulong uVar10;
  Rune *pRVar11;
  LogMessageFatal local_1b0;
  
  uVar10 = 0;
  if (this->failed_ != false) goto switchD_0013050b_caseD_1;
  switch(re->op_) {
  case '\x01':
    goto switchD_0013050b_caseD_1;
  case '\x02':
    goto switchD_0013050b_caseD_2;
  case '\x03':
    RVar2 = Regexp::rune(re);
    FVar6 = Literal(this,RVar2,(bool)((byte)re->parse_flags_ & 1));
    break;
  case '\x04':
    iVar3 = Regexp::nrunes(re);
    if (iVar3 != 0) {
      uVar10 = 0;
      FVar6.begin = 0;
      FVar6.end.p = 0;
      for (lVar9 = 0; iVar3 = Regexp::nrunes(re), lVar9 < iVar3; lVar9 = lVar9 + 1) {
        pRVar8 = Regexp::runes(re);
        FVar7 = Literal(this,pRVar8[lVar9],(bool)((byte)re->parse_flags_ & 1));
        if (lVar9 != 0) {
          FVar7 = Cat(this,(Frag)((ulong)FVar6 | uVar10 << 0x20),FVar7);
        }
        uVar10 = (ulong)FVar7 >> 0x20;
        FVar6 = (Frag)((ulong)FVar7 & 0xffffffff);
      }
      goto LAB_00130871;
    }
    goto switchD_0013050b_caseD_2;
  case '\x05':
    FVar6 = *child_frags;
    for (lVar9 = 1; lVar9 < nchild_frags; lVar9 = lVar9 + 1) {
      FVar6 = Cat(this,FVar6,child_frags[lVar9]);
    }
    break;
  case '\x06':
    FVar6 = *child_frags;
    for (lVar9 = 1; lVar9 < nchild_frags; lVar9 = lVar9 + 1) {
      FVar6 = Alt(this,FVar6,child_frags[lVar9]);
    }
    break;
  case '\a':
    FVar6 = Star(this,*child_frags,SUB41((re->parse_flags_ & 0x40) >> 6,0));
    break;
  case '\b':
    FVar6 = Plus(this,*child_frags,SUB41((re->parse_flags_ & 0x40) >> 6,0));
    break;
  case '\t':
    FVar6 = Quest(this,*child_frags,SUB41((re->parse_flags_ & 0x40) >> 6,0));
    break;
  default:
    LogMessageFatal::LogMessageFatal
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/compile.cc",
               0x3dd);
    this_00 = std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,
                              "Missing case in Compiler: ");
    std::ostream::operator<<(this_00,(uint)re->op_);
    LogMessageFatal::~LogMessageFatal(&local_1b0);
    this->failed_ = true;
    goto switchD_0013050b_caseD_1;
  case '\v':
    iVar3 = Regexp::cap(re);
    FVar6 = *child_frags;
    if (-1 < iVar3) {
      iVar3 = Regexp::cap(re);
      FVar6 = Capture(this,FVar6,iVar3);
    }
    break;
  case '\f':
    BeginRange(this);
    AddRuneRange(this,0,0x10ffff,false);
LAB_001305ed:
    FVar6 = this->rune_range_;
    break;
  case '\r':
    FVar6 = ByteRange(this,0,0xff,false);
    break;
  case '\x0e':
    empty = this->reversed_ + kEmptyBeginLine;
    goto LAB_00130822;
  case '\x0f':
    empty = kEmptyEndLine - this->reversed_;
    goto LAB_00130822;
  case '\x10':
    empty = kEmptyWordBoundary;
    goto LAB_00130822;
  case '\x11':
    empty = kEmptyNonWordBoundary;
    goto LAB_00130822;
  case '\x12':
    uVar4 = (uint)this->reversed_;
    goto LAB_0013081b;
  case '\x13':
    uVar4 = this->reversed_ ^ 1;
LAB_0013081b:
    empty = uVar4 * 4 + kEmptyBeginText;
LAB_00130822:
    FVar6 = EmptyWidth(this,empty);
    break;
  case '\x14':
    pCVar5 = Regexp::cc(re);
    if (*(int *)(pCVar5 + 4) != 0) {
      CVar1 = *pCVar5;
      BeginRange(this);
      pRVar8 = *(Rune **)(pCVar5 + 8);
      for (pRVar11 = pRVar8; pRVar11 != pRVar8 + (long)*(int *)(pCVar5 + 0x10) * 2;
          pRVar11 = pRVar11 + 2) {
        RVar2 = *pRVar11;
        if (CVar1 == (CharClass)0x0) {
LAB_00130578:
          if (RVar2 < 0x42) {
LAB_0013057d:
            uVar4 = pRVar11[1];
            if ((int)uVar4 < 0x7a) goto LAB_0013058c;
LAB_0013059c:
            foldcase = false;
          }
          else {
            uVar4 = pRVar11[1];
LAB_0013058c:
            if (0x7a < RVar2 || (int)uVar4 < 0x41) goto LAB_0013059c;
            foldcase = (bool)((0x60 < uVar4 || RVar2 < 0x5b) & (byte)CVar1);
          }
          AddRuneRange(this,RVar2,uVar4,foldcase);
          pRVar8 = *(Rune **)(pCVar5 + 8);
        }
        else {
          if (RVar2 < 0x41) goto LAB_0013057d;
          if (0x5a < pRVar11[1]) goto LAB_00130578;
        }
      }
      goto LAB_001305ed;
    }
    LogMessageFatal::LogMessageFatal
              (&local_1b0,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/compile.cc",
               0x3a3);
    std::operator<<((ostream *)&local_1b0.super_LogMessage.str_,"No ranges in char class");
    LogMessageFatal::~LogMessageFatal(&local_1b0);
    this->failed_ = true;
    FVar6.begin = 0;
    FVar6.end.p = 0;
    break;
  case '\x15':
    iVar3 = Regexp::match_id(re);
    FVar6 = Match(this,iVar3);
    if (this->anchor_ != ANCHOR_BOTH) {
      FVar7 = DotStar(this);
      a = EmptyWidth(this,kEmptyEndText);
      FVar6 = Cat(this,a,FVar6);
      FVar6 = Cat(this,FVar7,FVar6);
    }
  }
LAB_0013086d:
  uVar10 = (ulong)FVar6 >> 0x20;
LAB_00130871:
  return (Frag)((ulong)FVar6 & 0xffffffff | uVar10 << 0x20);
switchD_0013050b_caseD_2:
  FVar6 = Nop(this);
  goto LAB_0013086d;
switchD_0013050b_caseD_1:
  FVar6.begin = 0;
  FVar6.end.p = 0;
  goto LAB_00130871;
}

Assistant:

Frag Compiler::PostVisit(Regexp* re, Frag, Frag, Frag* child_frags,
                         int nchild_frags) {
  // If a child failed, don't bother going forward, especially
  // since the child_frags might contain Frags with NULLs in them.
  if (failed_)
    return NoMatch();

  // Given the child fragments, return the fragment for this node.
  switch (re->op()) {
    case kRegexpRepeat:
      // Should not see; code at bottom of function will print error
      break;

    case kRegexpNoMatch:
      return NoMatch();

    case kRegexpEmptyMatch:
      return Nop();

    case kRegexpHaveMatch: {
      Frag f = Match(re->match_id());
      // Remember unanchored match to end of string.
      if (anchor_ != RE2::ANCHOR_BOTH)
        f = Cat(DotStar(), Cat(EmptyWidth(kEmptyEndText), f));
      return f;
    }

    case kRegexpConcat: {
      Frag f = child_frags[0];
      for (int i = 1; i < nchild_frags; i++)
        f = Cat(f, child_frags[i]);
      return f;
    }

    case kRegexpAlternate: {
      Frag f = child_frags[0];
      for (int i = 1; i < nchild_frags; i++)
        f = Alt(f, child_frags[i]);
      return f;
    }

    case kRegexpStar:
      return Star(child_frags[0], (re->parse_flags()&Regexp::NonGreedy) != 0);

    case kRegexpPlus:
      return Plus(child_frags[0], (re->parse_flags()&Regexp::NonGreedy) != 0);

    case kRegexpQuest:
      return Quest(child_frags[0], (re->parse_flags()&Regexp::NonGreedy) != 0);

    case kRegexpLiteral:
      return Literal(re->rune(), (re->parse_flags()&Regexp::FoldCase) != 0);

    case kRegexpLiteralString: {
      // Concatenation of literals.
      if (re->nrunes() == 0)
        return Nop();
      Frag f;
      for (int i = 0; i < re->nrunes(); i++) {
        Frag f1 = Literal(re->runes()[i],
                          (re->parse_flags()&Regexp::FoldCase) != 0);
        if (i == 0)
          f = f1;
        else
          f = Cat(f, f1);
      }
      return f;
    }

    case kRegexpAnyChar:
      BeginRange();
      AddRuneRange(0, Runemax, false);
      return EndRange();

    case kRegexpAnyByte:
      return ByteRange(0x00, 0xFF, false);

    case kRegexpCharClass: {
      CharClass* cc = re->cc();
      if (cc->empty()) {
        // This can't happen.
        LOG(DFATAL) << "No ranges in char class";
        failed_ = true;
        return NoMatch();
      }

      // ASCII case-folding optimization: if the char class
      // behaves the same on A-Z as it does on a-z,
      // discard any ranges wholly contained in A-Z
      // and mark the other ranges as foldascii.
      // This reduces the size of a program for
      // (?i)abc from 3 insts per letter to 1 per letter.
      bool foldascii = cc->FoldsASCII();

      // Character class is just a big OR of the different
      // character ranges in the class.
      BeginRange();
      for (CharClass::iterator i = cc->begin(); i != cc->end(); ++i) {
        // ASCII case-folding optimization (see above).
        if (foldascii && 'A' <= i->lo && i->hi <= 'Z')
          continue;

        // If this range contains all of A-Za-z or none of it,
        // the fold flag is unnecessary; don't bother.
        bool fold = foldascii;
        if ((i->lo <= 'A' && 'z' <= i->hi) || i->hi < 'A' || 'z' < i->lo ||
            ('Z' < i->lo && i->hi < 'a'))
          fold = false;

        AddRuneRange(i->lo, i->hi, fold);
      }
      return EndRange();
    }

    case kRegexpCapture:
      // If this is a non-capturing parenthesis -- (?:foo) --
      // just use the inner expression.
      if (re->cap() < 0)
        return child_frags[0];
      return Capture(child_frags[0], re->cap());

    case kRegexpBeginLine:
      return EmptyWidth(reversed_ ? kEmptyEndLine : kEmptyBeginLine);

    case kRegexpEndLine:
      return EmptyWidth(reversed_ ? kEmptyBeginLine : kEmptyEndLine);

    case kRegexpBeginText:
      return EmptyWidth(reversed_ ? kEmptyEndText : kEmptyBeginText);

    case kRegexpEndText:
      return EmptyWidth(reversed_ ? kEmptyBeginText : kEmptyEndText);

    case kRegexpWordBoundary:
      return EmptyWidth(kEmptyWordBoundary);

    case kRegexpNoWordBoundary:
      return EmptyWidth(kEmptyNonWordBoundary);
  }
  LOG(DFATAL) << "Missing case in Compiler: " << re->op();
  failed_ = true;
  return NoMatch();
}